

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O0

void opj_cio_close(opj_cio_t *cio)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    if (*(int *)((long)in_RDI + 8) == 2) {
      free(*(void **)((long)in_RDI + 0x10));
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void OPJ_CALLCONV opj_cio_close(opj_cio_t *cio) {
	if(cio) {
		if(cio->openmode == OPJ_STREAM_WRITE) {
			/* destroy the allocated buffer */
			opj_free(cio->buffer);
		}
		/* destroy the cio */
		opj_free(cio);
	}
}